

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O0

float rnd_well_nextf(rnd_well_t *well)

{
  uint value;
  float fVar1;
  rnd_well_t *well_local;
  
  value = rnd_well_next(well);
  fVar1 = rnd_internal_float_normalized_from_u32(value);
  return fVar1;
}

Assistant:

float rnd_well_nextf( rnd_well_t* well )
    {
    return rnd_internal_float_normalized_from_u32( rnd_well_next( well ) );
    }